

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O0

int jpc_dec_process_siz(jpc_dec_t *dec,jpc_ms_t *ms)

{
  _Bool _Var1;
  int iVar2;
  jpc_dec_cp_t *pjVar3;
  void *pvVar4;
  jas_matrix_t *local_a0;
  uint_fast32_t local_98;
  uint_fast32_t local_90;
  uint_fast32_t local_88;
  ulong local_78;
  size_t tile_samples;
  size_t total_samples;
  size_t num_samples_delta;
  size_t num_samples;
  size_t size;
  jpc_dec_cmpt_t *cmpt;
  int vtileno;
  int htileno;
  jpc_dec_tcomp_t *tcomp;
  jpc_dec_tile_t *tile;
  int tileno;
  int compno;
  jpc_siz_t *siz;
  jpc_ms_t *ms_local;
  jpc_dec_t *dec_local;
  
  _tileno = &ms->parms;
  siz = (jpc_siz_t *)ms;
  ms_local = (jpc_ms_t *)dec;
  _Var1 = jas_safe_size_mul((ms->parms).sot.len,(ms->parms).siz.height,&tile_samples);
  if ((_Var1) && ((ms_local[1].parms.siz.yoff == 0 || (tile_samples <= ms_local[1].parms.siz.yoff)))
     ) {
    _Var1 = jas_safe_size_mul((_tileno->siz).tilewidth,(_tileno->siz).tileheight,&local_78);
    if ((_Var1) && ((ms_local[1].parms.siz.yoff == 0 || (local_78 <= ms_local[1].parms.siz.yoff))))
    {
      ms_local->len = (_tileno->siz).xoff;
      ms_local->off = (_tileno->siz).yoff;
      (ms_local->parms).sot.tileno = (_tileno->sot).len;
      (ms_local->parms).sot.len = (_tileno->siz).height;
      (ms_local->parms).siz.height = (_tileno->siz).tilewidth;
      (ms_local->parms).siz.xoff = (_tileno->siz).tileheight;
      (ms_local->parms).siz.yoff = (_tileno->siz).tilexoff;
      (ms_local->parms).siz.tilewidth = (_tileno->siz).tileyoff;
      *(int *)((long)&ms_local->parms + 0x50) = (int)(_tileno->siz).numcomps;
      pjVar3 = jpc_dec_cp_create((long)*(int *)((long)&ms_local->parms + 0x50));
      *(jpc_dec_cp_t **)((long)&ms_local->parms + 0x60) = pjVar3;
      if (pjVar3 == (jpc_dec_cp_t *)0x0) {
        dec_local._4_4_ = -1;
      }
      else {
        pvVar4 = jas_alloc2((long)*(int *)((long)&ms_local->parms + 0x50),0x40);
        ms_local[1].off = (uint_fast32_t)pvVar4;
        if (pvVar4 == (void *)0x0) {
          dec_local._4_4_ = -1;
        }
        else {
          num_samples_delta = 0;
          tile._4_4_ = 0;
          size = ms_local[1].off;
          for (; tile._4_4_ < *(int *)((long)&ms_local->parms + 0x50); tile._4_4_ = tile._4_4_ + 1)
          {
            *(ulong *)(size + 0x20) = (ulong)(_tileno->siz).comps[tile._4_4_].prec;
            *(bool *)(size + 0x28) = (_tileno->siz).comps[tile._4_4_].sgnd != '\0';
            *(ulong *)size = (ulong)(_tileno->siz).comps[tile._4_4_].hsamp;
            *(ulong *)(size + 8) = (ulong)(_tileno->siz).comps[tile._4_4_].vsamp;
            *(ulong *)(size + 0x10) =
                 (ulong)((ms_local->parms).unk.data + *(long *)size + -1) / *(ulong *)size -
                 ((ms_local->len + *(long *)size) - 1) / *(ulong *)size;
            *(ulong *)(size + 0x18) =
                 (ulong)((long)(ms_local->parms).poc.pchgs + *(long *)(size + 8) + -1) /
                 *(ulong *)(size + 8) -
                 ((ms_local->off + *(long *)(size + 8)) - 1) / *(ulong *)(size + 8);
            *(undefined8 *)(size + 0x30) = 0;
            *(undefined8 *)(size + 0x38) = 0;
            _Var1 = jas_safe_size_mul(*(size_t *)(size + 0x10),*(size_t *)(size + 0x18),
                                      &total_samples);
            if (!_Var1) {
              jas_eprintf("image too large\n");
              return -1;
            }
            _Var1 = jas_safe_size_add(num_samples_delta,total_samples,&num_samples_delta);
            if (!_Var1) {
              jas_eprintf("image too large\n");
              return -1;
            }
            size = size + 0x40;
          }
          if ((ms_local[1].parms.siz.yoff == 0) || (num_samples_delta <= ms_local[1].parms.siz.yoff)
             ) {
            ms_local->id = 0;
            *(int *)((long)&ms_local->parms + 0x30) =
                 (int)((ulong)((ms_local->parms).ppm.data +
                              (long)((ms_local->parms).unk.data + (-1 - (ms_local->parms).siz.yoff))
                              ) / (ms_local->parms).siz.height);
            *(int *)((long)&ms_local->parms + 0x34) =
                 (int)(((long)(ms_local->parms).poc.pchgs +
                       ((ms_local->parms).siz.xoff - (ms_local->parms).siz.tilewidth) + -1) /
                      (ms_local->parms).siz.xoff);
            if (*(int *)((long)&ms_local->parms + 0x30) < 0) {
              __assert_fail("dec->numhtiles >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                            ,0x534,"int jpc_dec_process_siz(jpc_dec_t *, jpc_ms_t *)");
            }
            if (*(int *)((long)&ms_local->parms + 0x34) < 0) {
              __assert_fail("dec->numvtiles >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                            ,0x535,"int jpc_dec_process_siz(jpc_dec_t *, jpc_ms_t *)");
            }
            _Var1 = jas_safe_size_mul((long)*(int *)((long)&ms_local->parms + 0x30),
                                      (long)*(int *)((long)&ms_local->parms + 0x34),&num_samples);
            if ((_Var1) && (num_samples < 0x80000000)) {
              if ((ms_local[1].parms.siz.yoff == 0) ||
                 (num_samples <= ms_local[1].parms.siz.yoff >> 8)) {
                if ((ms_local[1].parms.siz.yoff == 0) ||
                   (num_samples <=
                    ms_local[1].parms.siz.yoff /
                    (ulong)(long)*(int *)((long)&ms_local->parms + 0x50) >> 4)) {
                  *(int *)((long)&ms_local->parms + 0x38) = (int)num_samples;
                  iVar2 = jas_getdbglevel();
                  if (9 < iVar2) {
                    jas_eprintf("numtiles = %d; numhtiles = %d; numvtiles = %d;\n",
                                (ulong)*(uint *)((long)&ms_local->parms + 0x38),
                                (ulong)*(uint *)((long)&ms_local->parms + 0x30),
                                (ulong)*(uint *)((long)&ms_local->parms + 0x34));
                  }
                  pvVar4 = jas_alloc2((long)*(int *)((long)&ms_local->parms + 0x38),0x68);
                  (ms_local->parms).siz.tileyoff = (uint_fast32_t)pvVar4;
                  if (pvVar4 == (void *)0x0) {
                    dec_local._4_4_ = -1;
                  }
                  else {
                    tile._0_4_ = 0;
                    tcomp = (jpc_dec_tcomp_t *)(ms_local->parms).siz.tileyoff;
                    for (; (int)tile < *(int *)((long)&ms_local->parms + 0x38);
                        tile._0_4_ = (int)tile + 1) {
                      *(undefined4 *)&tcomp->xstart = 3;
                      tcomp = (jpc_dec_tcomp_t *)&tcomp[1].numrlvls;
                    }
                    tile._0_4_ = 0;
                    tcomp = (jpc_dec_tcomp_t *)(ms_local->parms).siz.tileyoff;
                    for (; (int)tile < *(int *)((long)&ms_local->parms + 0x38);
                        tile._0_4_ = (int)tile + 1) {
                      cmpt._4_4_ = (int)tile % *(int *)((long)&ms_local->parms + 0x30);
                      cmpt._0_4_ = (int)tile / *(int *)((long)&ms_local->parms + 0x30);
                      *(undefined4 *)&tcomp[1].yend = 0;
                      *(undefined4 *)&tcomp->xstart = 0;
                      if (ms_local->len <
                          (ms_local->parms).siz.yoff +
                          (long)cmpt._4_4_ * (ms_local->parms).siz.height) {
                        local_88 = (ms_local->parms).siz.yoff +
                                   (long)cmpt._4_4_ * (ms_local->parms).siz.height;
                      }
                      else {
                        local_88 = ms_local->len;
                      }
                      tcomp->ystart = local_88;
                      if (ms_local->off <
                          (ms_local->parms).siz.tilewidth +
                          (long)(int)cmpt * (ms_local->parms).siz.xoff) {
                        local_90 = (ms_local->parms).siz.tilewidth +
                                   (long)(int)cmpt * (ms_local->parms).siz.xoff;
                      }
                      else {
                        local_90 = ms_local->off;
                      }
                      tcomp->xend = local_90;
                      if ((ms_local->parms).siz.yoff +
                          (long)(cmpt._4_4_ + 1) * (ms_local->parms).siz.height <
                          (ms_local->parms).sot.tileno) {
                        local_98 = (ms_local->parms).siz.yoff +
                                   (long)(cmpt._4_4_ + 1) * (ms_local->parms).siz.height;
                      }
                      else {
                        local_98 = (ms_local->parms).sot.tileno;
                      }
                      tcomp->yend = local_98;
                      if ((ms_local->parms).siz.tilewidth +
                          (long)((int)cmpt + 1) * (ms_local->parms).siz.xoff <
                          (ms_local->parms).sot.len) {
                        local_a0 = (jas_matrix_t *)
                                   ((ms_local->parms).siz.tilewidth +
                                   (long)((int)cmpt + 1) * (ms_local->parms).siz.xoff);
                      }
                      else {
                        local_a0 = (jas_matrix_t *)(ms_local->parms).sot.len;
                      }
                      tcomp->data = local_a0;
                      *(undefined4 *)((long)&tcomp[1].xend + 4) = 0;
                      *(undefined4 *)&tcomp[1].xend = 0;
                      tcomp->rlvls = (jpc_dec_rlvl_t *)0x0;
                      tcomp->tsfb = (jpc_tsfb_t *)0x0;
                      *(undefined8 *)&tcomp->numrlvls = 0;
                      tcomp[1].xstart = 0;
                      tcomp[1].data = (jas_matrix_t *)0x0;
                      pvVar4 = jas_alloc2((long)*(int *)((long)&ms_local->parms + 0x50),0x40);
                      tcomp[1].ystart = (uint_fast32_t)pvVar4;
                      if (pvVar4 == (void *)0x0) {
                        return -1;
                      }
                      tile._4_4_ = 0;
                      size = ms_local[1].off;
                      _vtileno = (ulong *)tcomp[1].ystart;
                      for (; tile._4_4_ < *(int *)((long)&ms_local->parms + 0x50);
                          tile._4_4_ = tile._4_4_ + 1) {
                        _vtileno[6] = 0;
                        *(undefined4 *)(_vtileno + 5) = 0;
                        _vtileno[4] = 0;
                        *_vtileno = ((tcomp->ystart + *(long *)size) - 1) / *(ulong *)size;
                        _vtileno[1] = ((tcomp->xend + *(long *)(size + 8)) - 1) /
                                      *(ulong *)(size + 8);
                        _vtileno[2] = ((tcomp->yend + *(long *)size) - 1) / *(ulong *)size;
                        _vtileno[3] = (ulong)((long)tcomp->data + *(long *)(size + 8) + -1) /
                                      *(ulong *)(size + 8);
                        _vtileno[7] = 0;
                        size = size + 0x40;
                        _vtileno = _vtileno + 8;
                      }
                      tcomp = (jpc_dec_tcomp_t *)&tcomp[1].numrlvls;
                    }
                    ms_local[1].parms.sot.len = 0;
                    *(undefined4 *)&ms_local[1].len = 4;
                    dec_local._4_4_ = 0;
                  }
                }
                else {
                  dec_local._4_4_ = -1;
                }
              }
              else {
                dec_local._4_4_ = -1;
              }
            }
            else {
              dec_local._4_4_ = -1;
            }
          }
          else {
            jas_eprintf("maximum number of samples exceeded (%zu > %zu)\n",num_samples_delta,
                        ms_local[1].parms.siz.yoff);
            dec_local._4_4_ = -1;
          }
        }
      }
    }
    else {
      jas_eprintf("tile too large\n");
      dec_local._4_4_ = -1;
    }
  }
  else {
    jas_eprintf("image too large\n");
    dec_local._4_4_ = -1;
  }
  return dec_local._4_4_;
}

Assistant:

static int jpc_dec_process_siz(jpc_dec_t *dec, jpc_ms_t *ms)
{
	jpc_siz_t *siz = &ms->parms.siz;
	int compno;
	int tileno;
	jpc_dec_tile_t *tile;
	jpc_dec_tcomp_t *tcomp;
	int htileno;
	int vtileno;
	jpc_dec_cmpt_t *cmpt;
	size_t size;
	size_t num_samples;
	size_t num_samples_delta;

	size_t total_samples;
	if (!jas_safe_size_mul(siz->width, siz->height, &total_samples) ||
	    (dec->max_samples > 0 && total_samples > dec->max_samples)) {
		jas_eprintf("image too large\n");
		return -1;
	}

	size_t tile_samples;
	if (!jas_safe_size_mul(siz->tilewidth, siz->tileheight, &tile_samples) ||
	    (dec->max_samples > 0 && tile_samples > dec->max_samples)) {
		jas_eprintf("tile too large\n");
		return -1;
	}

	dec->xstart = siz->xoff;
	dec->ystart = siz->yoff;
	dec->xend = siz->width;
	dec->yend = siz->height;
	dec->tilewidth = siz->tilewidth;
	dec->tileheight = siz->tileheight;
	dec->tilexoff = siz->tilexoff;
	dec->tileyoff = siz->tileyoff;
	dec->numcomps = siz->numcomps;

	if (!(dec->cp = jpc_dec_cp_create(dec->numcomps))) {
		return -1;
	}

	if (!(dec->cmpts = jas_alloc2(dec->numcomps, sizeof(jpc_dec_cmpt_t)))) {
		return -1;
	}

	num_samples = 0;
	for (compno = 0, cmpt = dec->cmpts; compno < dec->numcomps; ++compno,
	  ++cmpt) {
		cmpt->prec = siz->comps[compno].prec;
		cmpt->sgnd = siz->comps[compno].sgnd;
		cmpt->hstep = siz->comps[compno].hsamp;
		cmpt->vstep = siz->comps[compno].vsamp;
		cmpt->width = JPC_CEILDIV(dec->xend, cmpt->hstep) -
		  JPC_CEILDIV(dec->xstart, cmpt->hstep);
		cmpt->height = JPC_CEILDIV(dec->yend, cmpt->vstep) -
		  JPC_CEILDIV(dec->ystart, cmpt->vstep);
		cmpt->hsubstep = 0;
		cmpt->vsubstep = 0;

		if (!jas_safe_size_mul(cmpt->width, cmpt->height, &num_samples_delta)) {
			jas_eprintf("image too large\n");
			return -1;
		}
		if (!jas_safe_size_add(num_samples, num_samples_delta, &num_samples)) {
			jas_eprintf("image too large\n");
			return -1;
		}
	}

	if (dec->max_samples > 0 && num_samples > dec->max_samples) {
		jas_eprintf("maximum number of samples exceeded (%zu > %zu)\n",
		  num_samples, dec->max_samples);
		return -1;
	}

	dec->image = 0;

	dec->numhtiles = JPC_CEILDIV(dec->xend - dec->tilexoff, dec->tilewidth);
	dec->numvtiles = JPC_CEILDIV(dec->yend - dec->tileyoff, dec->tileheight);
	assert(dec->numhtiles >= 0);
	assert(dec->numvtiles >= 0);
	if (!jas_safe_size_mul(dec->numhtiles, dec->numvtiles, &size) ||
	  size > INT_MAX) {
		return -1;
	}
	if (dec->max_samples > 0 && size > dec->max_samples / 16 / 16) {
		/* avoid Denial of Service by a malicious input file
		   with millions of tiny tiles; if max_samples is
		   configured, then assume the tiles are at least
		   16x16, and don't allow more than this number of
		   tiles */
		return -1;
	}
	if (dec->max_samples > 0 && size > dec->max_samples / dec->numcomps / 16) {
		/* another DoS check: since each tile allocates an
		   array of components, this check attempts to catch
		   excessive tile*component numbers */
		return -1;
	}
	dec->numtiles = size;
	JAS_DBGLOG(10, ("numtiles = %d; numhtiles = %d; numvtiles = %d;\n",
	  dec->numtiles, dec->numhtiles, dec->numvtiles));
	if (!(dec->tiles = jas_alloc2(dec->numtiles, sizeof(jpc_dec_tile_t)))) {
		return -1;
	}

	for (tileno = 0, tile = dec->tiles; tileno < dec->numtiles; ++tileno,
	  ++tile) {
		/* initialize all tiles with JPC_TILE_DONE so
		   jpc_dec_destroy() knows which ones need a
		   jpc_dec_tilefini() call; they are not actually
		   "done", of course */
		tile->state = JPC_TILE_DONE;
	}

	for (tileno = 0, tile = dec->tiles; tileno < dec->numtiles; ++tileno,
	  ++tile) {
		htileno = tileno % dec->numhtiles;
		vtileno = tileno / dec->numhtiles;
		tile->realmode = 0;
		tile->state = JPC_TILE_INIT;
		tile->xstart = JAS_MAX(dec->tilexoff + htileno * dec->tilewidth,
		  dec->xstart);
		tile->ystart = JAS_MAX(dec->tileyoff + vtileno * dec->tileheight,
		  dec->ystart);
		tile->xend = JAS_MIN(dec->tilexoff + (htileno + 1) *
		  dec->tilewidth, dec->xend);
		tile->yend = JAS_MIN(dec->tileyoff + (vtileno + 1) *
		  dec->tileheight, dec->yend);
		tile->numparts = 0;
		tile->partno = 0;
		tile->pkthdrstream = 0;
		tile->pkthdrstreampos = 0;
		tile->pptstab = 0;
		tile->cp = 0;
		tile->pi = 0;
		if (!(tile->tcomps = jas_alloc2(dec->numcomps,
		  sizeof(jpc_dec_tcomp_t)))) {
			return -1;
		}
		for (compno = 0, cmpt = dec->cmpts, tcomp = tile->tcomps;
		  compno < dec->numcomps; ++compno, ++cmpt, ++tcomp) {
			tcomp->rlvls = 0;
			tcomp->numrlvls = 0;
			tcomp->data = 0;
			tcomp->xstart = JPC_CEILDIV(tile->xstart, cmpt->hstep);
			tcomp->ystart = JPC_CEILDIV(tile->ystart, cmpt->vstep);
			tcomp->xend = JPC_CEILDIV(tile->xend, cmpt->hstep);
			tcomp->yend = JPC_CEILDIV(tile->yend, cmpt->vstep);
			tcomp->tsfb = 0;
		}
	}

	dec->pkthdrstreams = 0;

	/* We should expect to encounter other main header marker segments
	  or an SOT marker segment next. */
	dec->state = JPC_MH;

	return 0;
}